

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,HttpHeaderTable *responseHeaderTable,AsyncIoStream *stream,
                 HttpClientSettings *settings)

{
  HttpClientImpl *this_00;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_90;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_80;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> local_70;
  HttpClientSettings local_60;
  
  local_90.disposer = (Disposer *)&NullDisposer::instance;
  local_90.ptr = stream;
  this_00 = (HttpClientImpl *)operator_new(0x178);
  local_80.disposer = (Disposer *)&NullDisposer::instance;
  local_90.ptr = (AsyncIoStream *)0x0;
  local_80.ptr = stream;
  HttpClientSettings::HttpClientSettings(&local_60,settings);
  anon_unknown_36::HttpClientImpl::HttpClientImpl(this_00,responseHeaderTable,&local_80,&local_60);
  local_70.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
  local_70.ptr = this_00;
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_80);
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
  *(HttpClientImpl **)(this + 8) = this_00;
  local_70.ptr = (HttpClientImpl *)0x0;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&local_70);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_90);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newHttpClient(
    const HttpHeaderTable& responseHeaderTable, kj::AsyncIoStream& stream,
    HttpClientSettings settings) {
  return kj::heap<HttpClientImpl>(responseHeaderTable,
      kj::Own<kj::AsyncIoStream>(&stream, kj::NullDisposer::instance),
      kj::mv(settings));
}